

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int unres_schema_dup(lys_module *mod,unres_schema *unres,void *item,UNRES_ITEM type,void *new_item)

{
  undefined8 *puVar1;
  int iVar2;
  lys_node *snode;
  char *pcVar3;
  void **item_00;
  ly_ctx *ctx;
  undefined8 uVar4;
  void *local_50;
  unres_list_uniq aux_uniq;
  
  if ((((type == UNRES_WHEN) || (type == UNRES_INSTID)) || (type == UNRES_LEAFREF)) ||
     ((item == (void *)0x0 || (new_item == (void *)0x0)))) {
    __assert_fail("item && new_item && ((type != UNRES_LEAFREF) && (type != UNRES_INSTID) && (type != UNRES_WHEN))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x1daa,
                  "int unres_schema_dup(struct lys_module *, struct unres_schema *, void *, enum UNRES_ITEM, void *)"
                 );
  }
  item_00 = (void **)item;
  if (type == UNRES_LIST_UNIQ) {
    item_00 = &local_50;
    aux_uniq.list = *(lys_node **)((long)new_item + 8);
    local_50 = item;
  }
  iVar2 = unres_schema_find(unres,-1,item_00,type);
  if (iVar2 == -1) {
    if (type == UNRES_LIST_UNIQ) {
      free(new_item);
      return 1;
    }
    return 1;
  }
  if (type != UNRES_USES) {
    if (type == UNRES_IFFEAT) {
      snode = (lys_node *)malloc(0x18);
      if (snode == (lys_node *)0x0) {
        ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","unres_schema_dup");
        return -1;
      }
      aux_uniq.trg_type = (uint8_t *)(long)iVar2;
      pcVar3 = lydict_insert(mod->ctx,*(char **)((long)unres->str_snode[(long)aux_uniq.trg_type] + 8
                                                ),0);
      snode->dsc = pcVar3;
      puVar1 = (undefined8 *)unres->str_snode[(long)aux_uniq.trg_type];
      snode->name = (char *)*puVar1;
      *(undefined4 *)&snode->ref = *(undefined4 *)(puVar1 + 2);
      iVar2 = unres_schema_add_node(mod,unres,new_item,UNRES_IFFEAT,snode);
      if (iVar2 != -1) {
        return 0;
      }
      ctx = mod->ctx;
      uVar4 = 0x1dc9;
      goto LAB_0011a752;
    }
    if (((type != UNRES_TYPE_LEAFREF) && (type != UNRES_FEATURE)) &&
       ((type != UNRES_LIST_UNIQ && (type != UNRES_TYPE_DFLT)))) {
      iVar2 = unres_schema_add_str(mod,unres,new_item,type,(char *)unres->str_snode[iVar2]);
      if (iVar2 != -1) {
        return 0;
      }
      ctx = mod->ctx;
      uVar4 = 0x1dce;
      goto LAB_0011a752;
    }
  }
  iVar2 = unres_schema_add_node(mod,unres,new_item,type,(lys_node *)unres->str_snode[iVar2]);
  if (iVar2 != -1) {
    return 0;
  }
  ctx = mod->ctx;
  uVar4 = 0x1dbe;
LAB_0011a752:
  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
         ,uVar4);
  return -1;
}

Assistant:

int
unres_schema_dup(struct lys_module *mod, struct unres_schema *unres, void *item, enum UNRES_ITEM type, void *new_item)
{
    int i;
    struct unres_list_uniq aux_uniq;
    struct unres_iffeat_data *iff_data;

    assert(item && new_item && ((type != UNRES_LEAFREF) && (type != UNRES_INSTID) && (type != UNRES_WHEN)));

    /* hack for UNRES_LIST_UNIQ, which stores multiple items behind its item */
    if (type == UNRES_LIST_UNIQ) {
        aux_uniq.list = item;
        aux_uniq.expr = ((struct unres_list_uniq *)new_item)->expr;
        item = &aux_uniq;
    }
    i = unres_schema_find(unres, -1, item, type);

    if (i == -1) {
        if (type == UNRES_LIST_UNIQ) {
            free(new_item);
        }
        return EXIT_FAILURE;
    }

    if ((type == UNRES_TYPE_LEAFREF) || (type == UNRES_USES) || (type == UNRES_TYPE_DFLT) ||
            (type == UNRES_FEATURE) || (type == UNRES_LIST_UNIQ)) {
        if (unres_schema_add_node(mod, unres, new_item, type, unres->str_snode[i]) == -1) {
            LOGINT(mod->ctx);
            return -1;
        }
    } else if (type == UNRES_IFFEAT) {
        /* duplicate unres_iffeature_data */
        iff_data = malloc(sizeof *iff_data);
        LY_CHECK_ERR_RETURN(!iff_data, LOGMEM(mod->ctx), -1);
        iff_data->fname = lydict_insert(mod->ctx, ((struct unres_iffeat_data *)unres->str_snode[i])->fname, 0);
        iff_data->node = ((struct unres_iffeat_data *)unres->str_snode[i])->node;
        iff_data->infeature = ((struct unres_iffeat_data *)unres->str_snode[i])->infeature;
        if (unres_schema_add_node(mod, unres, new_item, type, (struct lys_node *)iff_data) == -1) {
            LOGINT(mod->ctx);
            return -1;
        }
    } else {
        if (unres_schema_add_str(mod, unres, new_item, type, unres->str_snode[i]) == -1) {
            LOGINT(mod->ctx);
            return -1;
        }
    }

    return EXIT_SUCCESS;
}